

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

char * cm_zlib_gzgets(gzFile file,char *buf,int len)

{
  int iVar1;
  void *pvVar2;
  bool local_4d;
  uint local_4c;
  gz_statep state;
  uchar *eol;
  char *str;
  uint local_28;
  uint n;
  uint left;
  int len_local;
  char *buf_local;
  gzFile file_local;
  
  if (((file == (gzFile)0x0) || (buf == (char *)0x0)) || (len < 1)) {
    file_local = (gzFile)0x0;
  }
  else if ((file[1].have == 0x1c4f) &&
          ((*(int *)((long)&file[4].pos + 4) == 0 || (*(int *)((long)&file[4].pos + 4) == -5)))) {
    if ((int)file[4].pos != 0) {
      *(undefined4 *)&file[4].pos = 0;
      iVar1 = gz_skip((gz_statep)file,(off_t)file[4].next);
      if (iVar1 == -1) {
        return (char *)0x0;
      }
    }
    local_28 = len - 1;
    _left = buf;
    if (local_28 != 0) {
      do {
        if ((file->have == 0) && (iVar1 = gz_fetch((gz_statep)file), iVar1 == -1)) {
          return (char *)0x0;
        }
        if (file->have == 0) {
          *(undefined4 *)((long)&file[3].next + 4) = 1;
          break;
        }
        if (local_28 < file->have) {
          local_4c = local_28;
        }
        else {
          local_4c = file->have;
        }
        str._4_4_ = local_4c;
        pvVar2 = memchr(file->next,10,(ulong)local_4c);
        if (pvVar2 != (void *)0x0) {
          str._4_4_ = ((int)pvVar2 - (int)file->next) + 1;
        }
        memcpy(_left,file->next,(ulong)str._4_4_);
        file->have = file->have - str._4_4_;
        file->next = file->next + str._4_4_;
        file->pos = (ulong)str._4_4_ + file->pos;
        local_28 = local_28 - str._4_4_;
        _left = _left + str._4_4_;
        local_4d = local_28 != 0 && pvVar2 == (void *)0x0;
      } while (local_4d);
    }
    if (_left == buf) {
      file_local = (gzFile)0x0;
    }
    else {
      *_left = '\0';
      file_local = (gzFile)buf;
    }
  }
  else {
    file_local = (gzFile)0x0;
  }
  return (char *)file_local;
}

Assistant:

char * ZEXPORT gzgets(gzFile file, char *buf, int len) {
    unsigned left, n;
    char *str;
    unsigned char *eol;
    gz_statep state;

    /* check parameters and get internal structure */
    if (file == NULL || buf == NULL || len < 1)
        return NULL;
    state = (gz_statep)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
        (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return NULL;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return NULL;
    }

    /* copy output bytes up to new line or len - 1, whichever comes first --
       append a terminating zero to the string (we don't check for a zero in
       the contents, let the user worry about that) */
    str = buf;
    left = (unsigned)len - 1;
    if (left) do {
        /* assure that something is in the output buffer */
        if (state->x.have == 0 && gz_fetch(state) == -1)
            return NULL;                /* error */
        if (state->x.have == 0) {       /* end of file */
            state->past = 1;            /* read past end */
            break;                      /* return what we have */
        }

        /* look for end-of-line in current output buffer */
        n = state->x.have > left ? left : state->x.have;
        eol = (unsigned char *)memchr(state->x.next, '\n', n);
        if (eol != NULL)
            n = (unsigned)(eol - state->x.next) + 1;

        /* copy through end-of-line, or remainder if not found */
        memcpy(buf, state->x.next, n);
        state->x.have -= n;
        state->x.next += n;
        state->x.pos += n;
        left -= n;
        buf += n;
    } while (left && eol == NULL);

    /* return terminated string, or if nothing, end of file */
    if (buf == str)
        return NULL;
    buf[0] = 0;
    return str;
}